

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O1

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  size_type *psVar1;
  long lVar2;
  pointer pUVar3;
  bool bVar4;
  int iVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  UniValue *pUVar7;
  string *subnet_str;
  char *__end;
  pointer this;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  CBanEntry local_90;
  int version;
  CSubNet subnet;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar6 = UniValue::getValues(bans_json);
  this = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pUVar3 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pUVar3) {
    psVar1 = &subnet.network.m_addr._size;
    do {
      subnet.network.m_addr._union.indirect_contents.indirect = (char *)psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&subnet,"version","");
      pUVar7 = UniValue::operator[](this,(string *)&subnet);
      iVar5 = UniValue::getInt<int>(pUVar7);
      if ((size_type *)subnet.network.m_addr._union.indirect_contents.indirect != psVar1) {
        operator_delete(subnet.network.m_addr._union.indirect_contents.indirect,
                        CONCAT44(subnet.network.m_addr._20_4_,subnet.network.m_addr._size) + 1);
      }
      version = iVar5;
      if (iVar5 == 1) {
        subnet.network.m_addr._union.indirect_contents.indirect = (char *)psVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&subnet,"address","");
        pUVar7 = UniValue::operator[](this,(string *)&subnet);
        subnet_str = UniValue::get_str_abi_cxx11_(pUVar7);
        if ((size_type *)subnet.network.m_addr._union.indirect_contents.indirect != psVar1) {
          operator_delete(subnet.network.m_addr._union.indirect_contents.indirect,
                          CONCAT44(subnet.network.m_addr._20_4_,subnet.network.m_addr._size) + 1);
        }
        LookupSubNet(&subnet,subnet_str);
        bVar4 = CSubNet::IsValid(&subnet);
        if (bVar4) {
          CBanEntry::CBanEntry(&local_90,this);
          std::
          map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::insert_or_assign<CBanEntry>(bans,&subnet,&local_90);
        }
        else {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
          ;
          source_file_00._M_len = 0x5d;
          logging_function_00._M_str = "BanMapFromJson";
          logging_function_00._M_len = 0xe;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_00,source_file_00,0x45,ALL,Info,
                     (ConstevalFormatString<1U>)0x1137c29,subnet_str);
        }
        if (0x10 < subnet.network.m_addr._size) {
          free(subnet.network.m_addr._union.indirect_contents.indirect);
          subnet.network.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
      }
      else {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
        ;
        source_file._M_len = 0x5d;
        logging_function._M_str = "BanMapFromJson";
        logging_function._M_len = 0xe;
        LogPrintFormatInternal<int>
                  (logging_function,source_file,0x3f,ALL,Info,(ConstevalFormatString<1U>)0x1137bf1,
                   &version);
      }
      this = this + 1;
    } while (this != pUVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}